

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O2

void pzshape::TPZShapeLinear::Chebyshev(FADREAL *x,int num,TPZVec<Fad<double>_> *phi)

{
  Fad<double> *pFVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_68;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>_>
  local_58;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  local_48;
  
  if (0 < num) {
    local_48.fadexpr_.left_ =
         (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)0x3ff0000000000000;
    Fad<double>::operator=<double,_nullptr>(phi->fStore,(double *)&local_48);
    if (num != 1) {
      Fad<double>::operator=(phi->fStore + 1,x);
      lVar3 = (ulong)(uint)num - 2;
      lVar2 = 0x40;
      while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
        pFVar1 = phi->fStore;
        local_68.fadexpr_.right_ = (Fad<double> *)((long)&pFVar1[-1].val_ + lVar2);
        local_48.fadexpr_.right_.constant_ = 2.0;
        local_48.fadexpr_.right_.defaultVal = 0.0;
        local_58.fadexpr_.right_ = (Fad<double> *)((long)&pFVar1[-2].val_ + lVar2);
        local_58.fadexpr_.left_ = &local_48;
        local_68.fadexpr_.left_ = x;
        local_48.fadexpr_.left_ = &local_68;
        Fad<double>::operator=((Fad<double> *)((long)&pFVar1->val_ + lVar2),&local_58);
        lVar2 = lVar2 + 0x20;
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Chebyshev(FADREAL & x,int num,TPZVec<FADREAL> &phi){
		// Quadratic or higher shape functions
		if(num <= 0) return;
		//phi.Put(0,0,1.0);
		//dphi.Put(0,0, 0.0);
		phi[0] = 1.0; // <!> Remark: the derivatives other than the 0th are set to null
		if(num == 1) return;
		//phi.Put(1,0, x);
		//dphi.Put(0,1, 1.0);
		phi[1] = x;
		//phi[1].fastAccessDx(0)=1.0; // <!> Remark: the derivatives other than the 0th aren't set to null
		//just ensuring the derivatives are properly initialized and that FAD objects of more than
		// one derivative are used
		int ord;
		for(ord = 2;ord<num;ord++) {
			//phi.Put(ord,0, 2.0*x*phi(ord-1,0) - phi(ord-2,0));
			//dphi.Put(0,ord, 2.0*x*dphi(0,ord-1) + 2.0*phi(ord-1,0) - dphi(0,ord-2));
			phi[ord] = x * phi[ord-1] * 2.0 - phi[ord-2];
		}
	}